

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

uint64_t cpu_ppc_load_vtb_ppc(CPUPPCState_conflict *env)

{
  ppc_tb_t *tb_env_00;
  uint64_t uVar1;
  ppc_tb_t *tb_env;
  CPUPPCState_conflict *env_local;
  
  tb_env_00 = env->tb_env;
  uVar1 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar1 = cpu_ppc_get_tb_ppc(tb_env_00,uVar1,tb_env_00->vtb_offset);
  return uVar1;
}

Assistant:

uint64_t cpu_ppc_load_vtb(CPUPPCState *env)
{
    ppc_tb_t *tb_env = env->tb_env;

    return cpu_ppc_get_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL),
                          tb_env->vtb_offset);
}